

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfp.c
# Opt level: O3

int sfp_get_implemented_options(tcv_t *tcv,tcv_implemented_options_t *options)

{
  byte bVar1;
  int iVar2;
  
  iVar2 = -4;
  if ((options != (tcv_implemented_options_t *)0x0 && tcv != (tcv_t *)0x0) &&
     (tcv->data != (void *)0x0)) {
    options->bmp = '\0';
    bVar1 = *(byte *)((long)tcv->data + 0x41) & 1;
    options->bmp = bVar1;
    bVar1 = *(char *)((long)tcv->data + 0x41) * '\x02' & 2U | bVar1;
    options->bmp = bVar1;
    bVar1 = (*(byte *)((long)tcv->data + 0x41) & 1) << 2 | bVar1;
    options->bmp = bVar1;
    bVar1 = (*(byte *)((long)tcv->data + 0x42) & 1) << 3 | bVar1;
    options->bmp = bVar1;
    bVar1 = (*(byte *)((long)tcv->data + 0x42) & 1) << 4 | bVar1;
    options->bmp = bVar1;
    bVar1 = (*(byte *)((long)tcv->data + 0x42) & 1) << 5 | bVar1;
    options->bmp = bVar1;
    bVar1 = (*(byte *)((long)tcv->data + 0x42) & 1) << 6 | bVar1;
    options->bmp = bVar1;
    options->bmp = *(char *)((long)tcv->data + 0x42) * -0x80 + bVar1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int sfp_get_implemented_options(tcv_t *tcv, tcv_implemented_options_t *options)
{
	if (tcv == NULL || options == NULL || tcv->data == NULL)
		return TCV_ERR_INVALID_ARG;

	/* Clear options */
	options->bmp = 0;

	/* Information stored in BASIC_INFO_REG_OPTIONS */
	options->bits.cooled_laser_transmitted = ((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_OPTIONS];
	options->bits.power_lever_2 = ((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_OPTIONS];
	options->bits.linear_receiver_out = ((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_OPTIONS];

	/* Information stored in BASIC_INFO_REG_OPTIONS + 1 */
	options->bits.rate_select = ((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_OPTIONS + 1];
	options->bits.tx_disable = ((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_OPTIONS + 1];
	options->bits.tx_fault = ((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_OPTIONS + 1];
	options->bits.signal_detect = ((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_OPTIONS + 1];
	options->bits.los = ((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_OPTIONS + 1];

	return 0;
}